

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O2

void luckyCanonicizerS_F_first_16Vars1
               (word *pInOut,int nVars,int nWords,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  
  if ((*pCanonPhase >> (nVars + 1U & 0x1f) & 1) == 0) {
    do {
      iVar1 = minimalSwapAndFlipIVar_superFast_all_noEBFC
                        (pInOut,nVars,nWords,pStore,pCanonPerm,pCanonPhase);
    } while (iVar1 != 0);
  }
  else {
    do {
      iVar1 = minimalSwapAndFlipIVar_superFast_all
                        (pInOut,nVars,nWords,pStore,pCanonPerm,pCanonPhase);
    } while (iVar1 != 0);
  }
  return;
}

Assistant:

void luckyCanonicizerS_F_first_16Vars1(word* pInOut, int  nVars, int nWords, int * pStore, char * pCanonPerm, unsigned* pCanonPhase)
{
    if(((* pCanonPhase) >> (nVars+1)) & 1)
        while( minimalSwapAndFlipIVar_superFast_all(pInOut, nVars, nWords, pStore, pCanonPerm, pCanonPhase) != 0)
            continue;
    else
        while( minimalSwapAndFlipIVar_superFast_all_noEBFC(pInOut, nVars, nWords, pStore, pCanonPerm, pCanonPhase) != 0)
            continue;
}